

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall
wasm_tabletype_t::wasm_tabletype_t
          (wasm_tabletype_t *this,wasm_valtype_t *type,wasm_limits_t *limits)

{
  Type local_40;
  undefined1 local_38 [16];
  undefined2 local_28;
  undefined1 local_26;
  
  local_38._8_4_ = (*limits).max;
  local_38._0_8_ = (ulong)*limits & 0xffffffff;
  local_38._12_4_ = 0;
  local_28 = 1;
  local_26 = 0;
  std::make_unique<wabt::interp::TableType,wabt::Type&,wabt::Limits>(&local_40,(Limits *)type);
  (this->super_wasm_externtype_t).I._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false> =
       (_Head_base<0UL,_wabt::interp::ExternType_*,_false>)local_40;
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_externtype_t_0024ec68;
  (this->elemtype).I = type->I;
  this->limits = *limits;
  wasm_valtype_delete(type);
  return;
}

Assistant:

wasm_tabletype_t(own wasm_valtype_t* type, const wasm_limits_t* limits)
      : wasm_externtype_t{std::make_unique<TableType>(type->I,
                                                      ToWabtLimits(*limits))},
        elemtype(*type),
        limits(*limits) {
    wasm_valtype_delete(type);
  }